

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O0

GLboolean __thiscall
glcts::TextureCubeMapArrayTextureSizeRTComputeShader::isMutableTextureTestable
          (TextureCubeMapArrayTextureSizeRTComputeShader *this)

{
  bool bVar1;
  ContextType type;
  RenderContext *pRVar2;
  TextureCubeMapArrayTextureSizeRTComputeShader *this_local;
  
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_TextureCubeMapArrayTextureSizeRTBase).
                      super_TextureCubeMapArrayTextureSizeBase.super_TestCaseBase.m_context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  bVar1 = glu::isContextTypeES(type);
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

glw::GLboolean TextureCubeMapArrayTextureSizeRTComputeShader::isMutableTextureTestable(void)
{
	/**
	 * Mutable textures cannot be bound as image textures on ES, but can be on
	 * desktop GL. This check enables/disables testing of mutable image textures.
	 */
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		return true;
	}
	else
	{
		return false;
	}
}